

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

avector<Vec3ff> *
embree::bspline_to_bezier_helper
          (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           *indices,avector<Vec3ff> *positions)

{
  undefined8 uVar1;
  ulong uVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  Vec3fx *pVVar5;
  const_reference pvVar6;
  long in_RDX;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_RSI;
  avector<Vec3ff> *in_RDI;
  vfloat4 v3;
  vfloat4 v2;
  vfloat4 v1;
  vfloat4 v0;
  size_t idx;
  size_t i_4;
  avector<Vec3ff> *positions_o;
  size_t i_5;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  void *in_stack_fffffffffffff018;
  size_t in_stack_fffffffffffff020;
  size_t in_stack_fffffffffffff028;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  ulong local_db0;
  ulong local_da8;
  undefined1 local_d89;
  long local_d88;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *local_d80;
  ulong local_d68;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  long local_d18;
  long local_d10;
  long local_d08;
  long local_d00;
  long local_cf8;
  long local_cf0;
  ulong local_ce8;
  long local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 *local_c30;
  undefined4 local_c24;
  undefined8 *local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 *local_c00;
  undefined4 local_bf4;
  undefined8 *local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 *local_bd0;
  undefined4 local_bc4;
  undefined8 *local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 *local_ba0;
  undefined4 local_b94;
  undefined8 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 *local_b70;
  undefined4 local_b64;
  undefined8 *local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 *local_b40;
  undefined4 local_b34;
  undefined8 *local_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 *local_b10;
  undefined4 local_b04;
  undefined8 *local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 *local_ae0;
  undefined4 local_ad4;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 *local_ab0;
  undefined4 local_aa4;
  undefined8 *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 *local_a80;
  undefined4 local_a74;
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 *local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 *local_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 *local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 *local_9d0;
  long local_9c8;
  long local_9b8;
  long local_9a8;
  long local_998;
  undefined8 *local_988;
  Vec3fx *local_980;
  undefined8 *local_978;
  Vec3fx *local_970;
  undefined8 *local_968;
  Vec3fx *local_960;
  undefined8 *local_958;
  Vec3fx *local_950;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  undefined8 *local_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 *local_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 *local_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 *local_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 *local_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined4 local_424;
  undefined8 *local_420;
  undefined4 local_414;
  undefined8 *local_410;
  undefined4 local_404;
  undefined8 *local_400;
  undefined4 local_3f4;
  undefined8 *local_3f0;
  undefined4 local_3e4;
  undefined8 *local_3e0;
  undefined4 local_3d4;
  undefined8 *local_3d0;
  undefined4 local_3c4;
  undefined8 *local_3c0;
  undefined4 local_3b4;
  undefined8 *local_3b0;
  undefined4 local_3a4;
  undefined8 *local_3a0;
  undefined4 local_394;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  ulong local_b8;
  ulong local_b0;
  Vec3fx *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_78;
  Vec3fx *local_68;
  Vec3fx *local_60;
  Vec3fx *local_58;
  Vec3fx *local_50;
  size_t local_48;
  Vec3fx *local_40;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  ulong local_8;
  
  local_d89 = 0;
  in_RDI->size_active = 0;
  in_RDI->size_alloced = 0;
  in_RDI->items = (Vec3fx *)0x0;
  local_d88 = in_RDX;
  local_d80 = in_RSI;
  sVar3 = std::
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ::size(in_RSI);
  local_88 = sVar3 << 2;
  local_d68 = local_88;
  local_18 = local_88;
  if (in_RDI->size_alloced < local_88) {
    local_8 = local_88;
    if (in_RDI->size_alloced != 0) {
      local_20 = in_RDI->size_alloced;
      while (local_20 < local_18) {
        local_30[1] = 1;
        local_30[0] = local_20 << 1;
        puVar4 = std::max<unsigned_long>(local_30 + 1,local_30);
        local_20 = *puVar4;
      }
      local_8 = local_20;
    }
  }
  else {
    local_8 = in_RDI->size_alloced;
  }
  local_90 = local_8;
  uVar2 = local_88;
  if (local_88 < in_RDI->size_active) {
    while (local_98 = uVar2, local_98 < in_RDI->size_active) {
      uVar2 = local_98 + 1;
    }
    in_RDI->size_active = local_88;
  }
  if (local_8 == in_RDI->size_alloced) {
    for (local_a0 = in_RDI->size_active; local_a0 < local_88; local_a0 = local_a0 + 1) {
      local_58 = in_RDI->items + local_a0;
    }
    in_RDI->size_active = local_88;
  }
  else {
    local_a8 = in_RDI->items;
    local_78 = local_8;
    pVVar5 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    in_RDI->items = pVVar5;
    for (local_b0 = 0; local_b0 < in_RDI->size_active; local_b0 = local_b0 + 1) {
      local_60 = in_RDI->items + local_b0;
      local_68 = local_a8 + local_b0;
      uVar1 = *(undefined8 *)((long)&local_68->field_0 + 8);
      *(undefined8 *)&local_60->field_0 = *(undefined8 *)&local_68->field_0;
      *(undefined8 *)((long)&local_60->field_0 + 8) = uVar1;
    }
    for (local_b8 = in_RDI->size_active; local_b8 < local_88; local_b8 = local_b8 + 1) {
      local_50 = in_RDI->items + local_b8;
    }
    local_48 = in_RDI->size_alloced;
    local_40 = local_a8;
    alignedFree(in_stack_fffffffffffff018);
    in_RDI->size_active = local_88;
    in_RDI->size_alloced = local_90;
  }
  for (local_da8 = 0; uVar2 = local_da8,
      sVar3 = std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::size(local_d80), uVar2 < sVar3; local_da8 = local_da8 + 1) {
    pvVar6 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[](local_d80,local_da8);
    local_db0 = (ulong)pvVar6->vertex;
    local_ce0 = local_d88;
    local_d28 = (undefined8 *)(*(long *)(local_d88 + 0x18) + local_db0 * 0x10);
    local_d20 = &local_dc8;
    local_878 = *local_d28;
    uStack_870 = local_d28[1];
    local_860 = &local_dc8;
    local_cf8 = local_db0 + 1;
    local_cf0 = local_d88;
    local_d38 = (undefined8 *)(*(long *)(local_d88 + 0x18) + local_cf8 * 0x10);
    local_d30 = &local_dd8;
    local_858 = *local_d38;
    uStack_850 = local_d38[1];
    local_840 = &local_dd8;
    local_d08 = local_db0 + 2;
    local_d00 = local_d88;
    local_d48 = (undefined8 *)(*(long *)(local_d88 + 0x18) + local_d08 * 0x10);
    local_d40 = &local_de8;
    local_838 = *local_d48;
    uStack_830 = local_d48[1];
    local_820 = &local_de8;
    local_d18 = local_db0 + 3;
    local_d10 = local_d88;
    local_d58 = (undefined8 *)(*(long *)(local_d88 + 0x18) + local_d18 * 0x10);
    local_d50 = &local_df8;
    local_818 = *local_d58;
    uStack_810 = local_d58[1];
    local_800 = &local_df8;
    local_a70 = &local_e38;
    local_a74 = 0x3e2aaaab;
    local_a80 = &local_dc8;
    local_420 = &local_a98;
    local_424 = 0x3e2aaaab;
    local_118 = 0x3e2aaaab;
    local_128 = 0x3e2aaaab;
    uStack_124 = 0x3e2aaaab;
    uStack_120 = 0x3e2aaaab;
    uStack_11c = 0x3e2aaaab;
    local_a98 = 0x3e2aaaab3e2aaaab;
    uStack_a90 = 0x3e2aaaab3e2aaaab;
    local_6a0 = &local_e38;
    local_6a8 = &local_a98;
    local_258 = 0x3e2aaaab3e2aaaab;
    uStack_250 = 0x3e2aaaab3e2aaaab;
    local_268._0_4_ = (float)local_dc8;
    local_268._4_4_ = (float)((ulong)local_dc8 >> 0x20);
    uStack_260._0_4_ = (float)uStack_dc0;
    uStack_260._4_4_ = (float)((ulong)uStack_dc0 >> 0x20);
    local_698 = (float)local_268 * 0.16666667;
    fStack_694 = local_268._4_4_ * 0.16666667;
    fStack_690 = (float)uStack_260 * 0.16666667;
    fStack_68c = uStack_260._4_4_ * 0.16666667;
    local_688 = &local_e38;
    local_7c8 = CONCAT44(fStack_694,local_698);
    uStack_7c0 = CONCAT44(fStack_68c,fStack_690);
    local_aa0 = &local_e48;
    local_aa4 = 0x3f2aaaab;
    local_ab0 = &local_dd8;
    local_410 = &local_ac8;
    local_414 = 0x3f2aaaab;
    local_138 = 0x3f2aaaab;
    local_148 = 0x3f2aaaab;
    uStack_144 = 0x3f2aaaab;
    uStack_140 = 0x3f2aaaab;
    uStack_13c = 0x3f2aaaab;
    local_ac8 = 0x3f2aaaab3f2aaaab;
    uStack_ac0 = 0x3f2aaaab3f2aaaab;
    local_660 = &local_e48;
    local_668 = &local_ac8;
    local_278 = 0x3f2aaaab3f2aaaab;
    uStack_270 = 0x3f2aaaab3f2aaaab;
    local_288._0_4_ = (float)local_dd8;
    local_288._4_4_ = (float)((ulong)local_dd8 >> 0x20);
    uStack_280._0_4_ = (float)uStack_dd0;
    uStack_280._4_4_ = (float)((ulong)uStack_dd0 >> 0x20);
    local_658 = (float)local_288 * 0.6666667;
    fStack_654 = local_288._4_4_ * 0.6666667;
    fStack_650 = (float)uStack_280 * 0.6666667;
    fStack_64c = uStack_280._4_4_ * 0.6666667;
    local_648 = &local_e48;
    local_7d8 = CONCAT44(fStack_654,local_658);
    uStack_7d0 = CONCAT44(fStack_64c,fStack_650);
    local_c50 = &local_e28;
    local_c58 = &local_e38;
    local_c60 = &local_e48;
    local_938 = local_698 + local_658;
    fStack_934 = fStack_694 + fStack_654;
    fStack_930 = fStack_690 + fStack_650;
    fStack_92c = fStack_68c + fStack_64c;
    local_920 = &local_e28;
    local_7a8 = CONCAT44(fStack_934,local_938);
    uStack_7a0 = CONCAT44(fStack_92c,fStack_930);
    local_ad0 = &local_e58;
    local_ad4 = 0x3e2aaaab;
    local_ae0 = &local_de8;
    local_400 = &local_af8;
    local_404 = 0x3e2aaaab;
    local_158 = 0x3e2aaaab;
    local_168 = 0x3e2aaaab;
    uStack_164 = 0x3e2aaaab;
    uStack_160 = 0x3e2aaaab;
    uStack_15c = 0x3e2aaaab;
    local_af8 = 0x3e2aaaab3e2aaaab;
    uStack_af0 = 0x3e2aaaab3e2aaaab;
    local_620 = &local_e58;
    local_628 = &local_af8;
    local_298 = 0x3e2aaaab3e2aaaab;
    uStack_290 = 0x3e2aaaab3e2aaaab;
    local_2a8._0_4_ = (float)local_de8;
    local_2a8._4_4_ = (float)((ulong)local_de8 >> 0x20);
    uStack_2a0._0_4_ = (float)uStack_de0;
    uStack_2a0._4_4_ = (float)((ulong)uStack_de0 >> 0x20);
    local_618 = (float)local_2a8 * 0.16666667;
    fStack_614 = local_2a8._4_4_ * 0.16666667;
    fStack_610 = (float)uStack_2a0 * 0.16666667;
    fStack_60c = uStack_2a0._4_4_ * 0.16666667;
    local_608 = &local_e58;
    local_7b8 = CONCAT44(fStack_614,local_618);
    uStack_7b0 = CONCAT44(fStack_60c,fStack_610);
    local_c68 = &local_e18;
    local_c70 = &local_e28;
    local_c78 = &local_e58;
    local_918 = local_938 + local_618;
    fStack_914 = fStack_934 + fStack_614;
    fStack_910 = fStack_930 + fStack_610;
    fStack_90c = fStack_92c + fStack_60c;
    local_900 = &local_e18;
    local_a48 = CONCAT44(fStack_914,local_918);
    uStack_a40 = CONCAT44(fStack_90c,fStack_910);
    local_a50 = &local_e18;
    local_a30 = &local_e08;
    local_998 = local_da8 * 4;
    local_950 = in_RDI->items + local_da8 * 4;
    local_958 = &local_e08;
    *(undefined8 *)&local_950->field_0 = local_a48;
    *(undefined8 *)((long)&local_950->field_0 + 8) = uStack_a40;
    local_b00 = &local_e88;
    local_b04 = 0x3f2aaaab;
    local_b10 = &local_dd8;
    local_3f0 = &local_b28;
    local_3f4 = 0x3f2aaaab;
    local_178 = 0x3f2aaaab;
    local_188 = 0x3f2aaaab;
    uStack_184 = 0x3f2aaaab;
    uStack_180 = 0x3f2aaaab;
    uStack_17c = 0x3f2aaaab;
    local_b28 = 0x3f2aaaab3f2aaaab;
    uStack_b20 = 0x3f2aaaab3f2aaaab;
    local_5e0 = &local_e88;
    local_5e8 = &local_b28;
    local_2b8 = 0x3f2aaaab3f2aaaab;
    uStack_2b0 = 0x3f2aaaab3f2aaaab;
    local_2c8 = local_dd8;
    uStack_2c0 = uStack_dd0;
    local_5d8 = (float)local_288 * 0.6666667;
    fStack_5d4 = local_288._4_4_ * 0.6666667;
    fStack_5d0 = (float)uStack_280 * 0.6666667;
    fStack_5cc = uStack_280._4_4_ * 0.6666667;
    local_5c8 = &local_e88;
    local_788 = CONCAT44(fStack_5d4,local_5d8);
    uStack_780 = CONCAT44(fStack_5cc,fStack_5d0);
    local_b30 = &local_e98;
    local_b34 = 0x3eaaaaab;
    local_b40 = &local_de8;
    local_3e0 = &local_b58;
    local_3e4 = 0x3eaaaaab;
    local_198 = 0x3eaaaaab;
    local_1a8 = 0x3eaaaaab;
    uStack_1a4 = 0x3eaaaaab;
    uStack_1a0 = 0x3eaaaaab;
    uStack_19c = 0x3eaaaaab;
    local_b58 = 0x3eaaaaab3eaaaaab;
    uStack_b50 = 0x3eaaaaab3eaaaaab;
    local_5a0 = &local_e98;
    local_5a8 = &local_b58;
    local_2d8 = 0x3eaaaaab3eaaaaab;
    uStack_2d0 = 0x3eaaaaab3eaaaaab;
    local_2e8 = local_de8;
    uStack_2e0 = uStack_de0;
    local_598 = (float)local_2a8 * 0.33333334;
    fStack_594 = local_2a8._4_4_ * 0.33333334;
    fStack_590 = (float)uStack_2a0 * 0.33333334;
    fStack_58c = uStack_2a0._4_4_ * 0.33333334;
    local_588 = &local_e98;
    local_798 = CONCAT44(fStack_594,local_598);
    uStack_790 = CONCAT44(fStack_58c,fStack_590);
    local_c80 = &local_e78;
    local_c88 = &local_e88;
    local_c90 = &local_e98;
    local_8f8 = local_5d8 + local_598;
    fStack_8f4 = fStack_5d4 + fStack_594;
    fStack_8f0 = fStack_5d0 + fStack_590;
    fStack_8ec = fStack_5cc + fStack_58c;
    local_8e0 = &local_e78;
    local_a28 = CONCAT44(fStack_8f4,local_8f8);
    uStack_a20 = CONCAT44(fStack_8ec,fStack_8f0);
    local_a58 = &local_e78;
    local_a10 = &local_e68;
    local_9a8 = local_da8 * 4 + 1;
    local_960 = in_RDI->items + local_9a8;
    local_968 = &local_e68;
    *(undefined8 *)&local_960->field_0 = local_a28;
    *(undefined8 *)((long)&local_960->field_0 + 8) = uStack_a20;
    local_b60 = &local_ec8;
    local_b64 = 0x3eaaaaab;
    local_b70 = &local_dd8;
    local_3d0 = &local_b88;
    local_3d4 = 0x3eaaaaab;
    local_1b8 = 0x3eaaaaab;
    local_1c8 = 0x3eaaaaab;
    uStack_1c4 = 0x3eaaaaab;
    uStack_1c0 = 0x3eaaaaab;
    uStack_1bc = 0x3eaaaaab;
    local_b88 = 0x3eaaaaab3eaaaaab;
    uStack_b80 = 0x3eaaaaab3eaaaaab;
    local_560 = &local_ec8;
    local_568 = &local_b88;
    local_2f8 = 0x3eaaaaab3eaaaaab;
    uStack_2f0 = 0x3eaaaaab3eaaaaab;
    local_308 = local_dd8;
    uStack_300 = uStack_dd0;
    local_558 = (float)local_288 * 0.33333334;
    fStack_554 = local_288._4_4_ * 0.33333334;
    fStack_550 = (float)uStack_280 * 0.33333334;
    fStack_54c = uStack_280._4_4_ * 0.33333334;
    local_548 = &local_ec8;
    local_768 = CONCAT44(fStack_554,local_558);
    uStack_760 = CONCAT44(fStack_54c,fStack_550);
    local_b90 = &local_ed8;
    local_b94 = 0x3f2aaaab;
    local_ba0 = &local_de8;
    local_3c0 = &local_bb8;
    local_3c4 = 0x3f2aaaab;
    local_1d8 = 0x3f2aaaab;
    local_1e8 = 0x3f2aaaab;
    uStack_1e4 = 0x3f2aaaab;
    uStack_1e0 = 0x3f2aaaab;
    uStack_1dc = 0x3f2aaaab;
    local_bb8 = 0x3f2aaaab3f2aaaab;
    uStack_bb0 = 0x3f2aaaab3f2aaaab;
    local_520 = &local_ed8;
    local_528 = &local_bb8;
    local_318 = 0x3f2aaaab3f2aaaab;
    uStack_310 = 0x3f2aaaab3f2aaaab;
    local_328 = local_de8;
    uStack_320 = uStack_de0;
    local_518 = (float)local_2a8 * 0.6666667;
    fStack_514 = local_2a8._4_4_ * 0.6666667;
    fStack_510 = (float)uStack_2a0 * 0.6666667;
    fStack_50c = uStack_2a0._4_4_ * 0.6666667;
    local_508 = &local_ed8;
    local_778 = CONCAT44(fStack_514,local_518);
    uStack_770 = CONCAT44(fStack_50c,fStack_510);
    local_c98 = &local_eb8;
    local_ca0 = &local_ec8;
    local_ca8 = &local_ed8;
    local_8d8 = local_558 + local_518;
    fStack_8d4 = fStack_554 + fStack_514;
    fStack_8d0 = fStack_550 + fStack_510;
    fStack_8cc = fStack_54c + fStack_50c;
    local_8c0 = &local_eb8;
    local_a08 = CONCAT44(fStack_8d4,local_8d8);
    uStack_a00 = CONCAT44(fStack_8cc,fStack_8d0);
    local_a60 = &local_eb8;
    local_9f0 = &local_ea8;
    local_9b8 = local_da8 * 4 + 2;
    local_970 = in_RDI->items + local_9b8;
    local_978 = &local_ea8;
    *(undefined8 *)&local_970->field_0 = local_a08;
    *(undefined8 *)((long)&local_970->field_0 + 8) = uStack_a00;
    local_bc0 = &local_f18;
    local_bc4 = 0x3e2aaaab;
    local_bd0 = &local_dd8;
    local_3b0 = &local_be8;
    local_3b4 = 0x3e2aaaab;
    local_1f8 = 0x3e2aaaab;
    local_208 = 0x3e2aaaab;
    uStack_204 = 0x3e2aaaab;
    uStack_200 = 0x3e2aaaab;
    uStack_1fc = 0x3e2aaaab;
    local_be8 = 0x3e2aaaab3e2aaaab;
    uStack_be0 = 0x3e2aaaab3e2aaaab;
    local_4e0 = &local_f18;
    local_4e8 = &local_be8;
    local_338 = 0x3e2aaaab3e2aaaab;
    uStack_330 = 0x3e2aaaab3e2aaaab;
    local_348 = local_dd8;
    uStack_340 = uStack_dd0;
    local_4d8 = (float)local_288 * 0.16666667;
    fStack_4d4 = local_288._4_4_ * 0.16666667;
    fStack_4d0 = (float)uStack_280 * 0.16666667;
    fStack_4cc = uStack_280._4_4_ * 0.16666667;
    local_4c8 = &local_f18;
    local_748 = CONCAT44(fStack_4d4,local_4d8);
    uStack_740 = CONCAT44(fStack_4cc,fStack_4d0);
    local_bf0 = &local_f28;
    local_bf4 = 0x3f2aaaab;
    local_c00 = &local_de8;
    local_3a0 = &local_c18;
    local_3a4 = 0x3f2aaaab;
    local_218 = 0x3f2aaaab;
    local_228 = 0x3f2aaaab;
    uStack_224 = 0x3f2aaaab;
    uStack_220 = 0x3f2aaaab;
    uStack_21c = 0x3f2aaaab;
    local_c18 = 0x3f2aaaab3f2aaaab;
    uStack_c10 = 0x3f2aaaab3f2aaaab;
    local_4a0 = &local_f28;
    local_4a8 = &local_c18;
    local_358 = 0x3f2aaaab3f2aaaab;
    uStack_350 = 0x3f2aaaab3f2aaaab;
    local_368 = local_de8;
    uStack_360 = uStack_de0;
    local_498 = (float)local_2a8 * 0.6666667;
    fStack_494 = local_2a8._4_4_ * 0.6666667;
    fStack_490 = (float)uStack_2a0 * 0.6666667;
    fStack_48c = uStack_2a0._4_4_ * 0.6666667;
    local_488 = &local_f28;
    local_758 = CONCAT44(fStack_494,local_498);
    uStack_750 = CONCAT44(fStack_48c,fStack_490);
    local_cb0 = &local_f08;
    local_cb8 = &local_f18;
    local_cc0 = &local_f28;
    local_8b8 = local_4d8 + local_498;
    fStack_8b4 = fStack_4d4 + fStack_494;
    fStack_8b0 = fStack_4d0 + fStack_490;
    fStack_8ac = fStack_4cc + fStack_48c;
    local_8a0 = &local_f08;
    local_728 = CONCAT44(fStack_8b4,local_8b8);
    uStack_720 = CONCAT44(fStack_8ac,fStack_8b0);
    local_c20 = &local_f38;
    local_c24 = 0x3e2aaaab;
    local_c30 = &local_df8;
    local_390 = &local_c48;
    local_394 = 0x3e2aaaab;
    local_238 = 0x3e2aaaab;
    local_248 = 0x3e2aaaab;
    uStack_244 = 0x3e2aaaab;
    uStack_240 = 0x3e2aaaab;
    uStack_23c = 0x3e2aaaab;
    local_c48 = 0x3e2aaaab3e2aaaab;
    uStack_c40 = 0x3e2aaaab3e2aaaab;
    local_460 = &local_f38;
    local_468 = &local_c48;
    local_378 = 0x3e2aaaab3e2aaaab;
    uStack_370 = 0x3e2aaaab3e2aaaab;
    local_388._0_4_ = (float)local_df8;
    local_388._4_4_ = (float)((ulong)local_df8 >> 0x20);
    uStack_380._0_4_ = (float)uStack_df0;
    uStack_380._4_4_ = (float)((ulong)uStack_df0 >> 0x20);
    local_458 = (float)local_388 * 0.16666667;
    fStack_454 = local_388._4_4_ * 0.16666667;
    fStack_450 = (float)uStack_380 * 0.16666667;
    fStack_44c = uStack_380._4_4_ * 0.16666667;
    local_440 = &local_f38;
    local_738 = CONCAT44(fStack_454,local_458);
    uStack_730 = CONCAT44(fStack_44c,fStack_450);
    local_cc8 = &local_ef8;
    local_cd0 = &local_f08;
    local_cd8 = &local_f38;
    local_898 = local_8b8 + local_458;
    fStack_894 = fStack_8b4 + fStack_454;
    fStack_890 = fStack_8b0 + fStack_450;
    fStack_88c = fStack_8ac + fStack_44c;
    local_880 = &local_ef8;
    local_9e8 = CONCAT44(fStack_894,local_898);
    uStack_9e0 = CONCAT44(fStack_88c,fStack_890);
    local_a68 = &local_ef8;
    local_9d0 = &local_ee8;
    local_9c8 = local_da8 * 4 + 3;
    local_980 = in_RDI->items + local_9c8;
    local_988 = &local_ee8;
    *(undefined8 *)&local_980->field_0 = local_9e8;
    *(undefined8 *)((long)&local_980->field_0 + 8) = uStack_9e0;
    local_ce8 = local_db0;
    local_7f8 = local_d28;
    local_7f0 = local_d38;
    local_7e8 = local_d48;
    local_7e0 = local_d58;
    local_710 = local_c60;
    local_708 = local_c58;
    local_700 = local_c78;
    local_6f8 = local_c70;
    local_6f0 = local_c90;
    local_6e8 = local_c88;
    local_6e0 = local_ca8;
    local_6d8 = local_ca0;
    local_6d0 = local_cc0;
    local_6c8 = local_cb8;
    local_6c0 = local_cd8;
    local_6b8 = local_cd0;
    local_6b0 = local_a80;
    local_680 = local_a80;
    local_678 = local_6a8;
    local_670 = local_ab0;
    local_640 = local_ab0;
    local_638 = local_668;
    local_630 = local_ae0;
    local_600 = local_ae0;
    local_5f8 = local_628;
    local_5f0 = local_b10;
    local_5c0 = local_b10;
    local_5b8 = local_5e8;
    local_5b0 = local_b40;
    local_580 = local_b40;
    local_578 = local_5a8;
    local_570 = local_b70;
    local_540 = local_b70;
    local_538 = local_568;
    local_530 = local_ba0;
    local_500 = local_ba0;
    local_4f8 = local_528;
    local_4f0 = local_bd0;
    local_4c0 = local_bd0;
    local_4b8 = local_4e8;
    local_4b0 = local_c00;
    local_480 = local_c00;
    local_478 = local_4a8;
    local_470 = local_c30;
    local_438 = local_c30;
    local_430 = local_468;
    local_388 = local_df8;
    uStack_380 = uStack_df0;
    local_2a8 = local_de8;
    uStack_2a0 = uStack_de0;
    local_288 = local_dd8;
    uStack_280 = uStack_dd0;
    local_268 = local_dc8;
    uStack_260 = uStack_dc0;
    local_f38 = local_738;
    uStack_f30 = uStack_730;
    local_f28 = local_758;
    uStack_f20 = uStack_750;
    local_f18 = local_748;
    uStack_f10 = uStack_740;
    local_f08 = local_728;
    uStack_f00 = uStack_720;
    local_ef8 = local_9e8;
    uStack_ef0 = uStack_9e0;
    local_ee8 = local_9e8;
    uStack_ee0 = uStack_9e0;
    local_ed8 = local_778;
    uStack_ed0 = uStack_770;
    local_ec8 = local_768;
    uStack_ec0 = uStack_760;
    local_eb8 = local_a08;
    uStack_eb0 = uStack_a00;
    local_ea8 = local_a08;
    uStack_ea0 = uStack_a00;
    local_e98 = local_798;
    uStack_e90 = uStack_790;
    local_e88 = local_788;
    uStack_e80 = uStack_780;
    local_e78 = local_a28;
    uStack_e70 = uStack_a20;
    local_e68 = local_a28;
    uStack_e60 = uStack_a20;
    local_e58 = local_7b8;
    uStack_e50 = uStack_7b0;
    local_e48 = local_7d8;
    uStack_e40 = uStack_7d0;
    local_e38 = local_7c8;
    uStack_e30 = uStack_7c0;
    local_e28 = local_7a8;
    uStack_e20 = uStack_7a0;
    local_e18 = local_a48;
    uStack_e10 = uStack_a40;
    local_e08 = local_a48;
    uStack_e00 = uStack_a40;
    local_df8 = local_818;
    uStack_df0 = uStack_810;
    local_de8 = local_838;
    uStack_de0 = uStack_830;
    local_dd8 = local_858;
    uStack_dd0 = uStack_850;
    local_dc8 = local_878;
    uStack_dc0 = uStack_870;
  }
  return in_RDI;
}

Assistant:

avector<Vec3ff> bspline_to_bezier_helper(const std::vector<SceneGraph::HairSetNode::Hair>& indices, const avector<Vec3ff>& positions)
  {
    avector<Vec3ff> positions_o;
    positions_o.resize(4*indices.size());
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i].vertex;
      const vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      const vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      const vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      const vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      positions_o[4*i+0] = Vec3ff((1.0f/6.0f)*v0 + (2.0f/3.0f)*v1 + (1.0f/6.0f)*v2);
      positions_o[4*i+1] = Vec3ff((2.0f/3.0f)*v1 + (1.0f/3.0f)*v2);
      positions_o[4*i+2] = Vec3ff((1.0f/3.0f)*v1 + (2.0f/3.0f)*v2);
      positions_o[4*i+3] = Vec3ff((1.0f/6.0f)*v1 + (2.0f/3.0f)*v2 + (1.0f/6.0f)*v3);
    }
    return positions_o;
  }